

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O0

void poly3_from_poly(poly3 *out,poly *in)

{
  uint16_t uVar1;
  ulong uVar2;
  crypto_word_t s_bit;
  uint local_40;
  int iStack_3c;
  uint16_t v;
  uint i;
  uint shift;
  crypto_word_t a;
  crypto_word_t s;
  crypto_word_t *words_a;
  crypto_word_t *words_s;
  poly *in_local;
  poly3 *out_local;
  
  s = (crypto_word_t)&out->a;
  a = 0;
  _i = 0;
  iStack_3c = 0;
  words_a = (crypto_word_t *)out;
  for (local_40 = 0; local_40 < 0x2bd; local_40 = local_40 + 1) {
    uVar1 = mod3((short)((in->field_0).v[local_40] << 3) >> 3);
    uVar2 = (long)(int)(uVar1 & 2) << 0x3e;
    a = uVar2 | a >> 1;
    _i = uVar2 | (long)(int)(uVar1 & 1) << 0x3f | _i >> 1;
    iStack_3c = iStack_3c + 1;
    if (iStack_3c == 0x40) {
      *words_a = a;
      words_a = words_a + 1;
      *(ulong *)s = _i;
      s = s + 8;
      _i = 0;
      a = 0;
      iStack_3c = 0;
    }
  }
  *words_a = a >> (0x40U - (char)iStack_3c & 0x3f);
  *(ulong *)s = _i >> (0x40U - (char)iStack_3c & 0x3f);
  return;
}

Assistant:

static void poly3_from_poly(struct poly3 *out, const struct poly *in) {
  crypto_word_t *words_s = out->s.v;
  crypto_word_t *words_a = out->a.v;
  crypto_word_t s = 0;
  crypto_word_t a = 0;
  unsigned shift = 0;

  for (unsigned i = 0; i < N; i++) {
    // This duplicates the 13th bit upwards to the top of the uint16,
    // essentially treating it as a sign bit and converting into a signed int16.
    // The signed value is reduced mod 3, yielding {0, 1, 2}.
    const uint16_t v = mod3((int16_t)(in->v[i] << 3) >> 3);
    s >>= 1;
    const crypto_word_t s_bit = (crypto_word_t)(v & 2) << (BITS_PER_WORD - 2);
    s |= s_bit;
    a >>= 1;
    a |= s_bit | (crypto_word_t)(v & 1) << (BITS_PER_WORD - 1);
    shift++;

    if (shift == BITS_PER_WORD) {
      *words_s = s;
      words_s++;
      *words_a = a;
      words_a++;
      s = a = 0;
      shift = 0;
    }
  }

  s >>= BITS_PER_WORD - shift;
  a >>= BITS_PER_WORD - shift;
  *words_s = s;
  *words_a = a;
}